

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O2

int lws_client_ws_upgrade(lws *wsi,char **cce)

{
  char *pcVar1;
  char cVar2;
  ah_data_idx_t aVar3;
  uint uVar4;
  uint uVar5;
  lws_context *plVar6;
  lws_vhost *plVar7;
  lws_protocols *plVar8;
  _lws_websocket_related *p_Var9;
  char cVar10;
  int iVar11;
  uint uVar12;
  lws_tokenize_elem lVar13;
  int iVar14;
  char *pcVar15;
  char *pcVar16;
  size_t sVar17;
  uchar *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  lws_protocols *plVar22;
  char *local_c0;
  lws_tokenize ts;
  char buf [64];
  
  if ((wsi->field_0x475 & 8) != 0) {
    _lws_log(2,"%s: client ws-over-h2 upgrade not supported yet\n","lws_client_ws_upgrade");
    iVar11 = 3;
    pcVar15 = "HS: h2 / ws upgrade unsupported";
    goto LAB_00129f05;
  }
  aVar3 = ((wsi->http).ah)->http_response;
  if (aVar3 != 0x65) {
    if (aVar3 == 0x191) {
      _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n",0x191);
      iVar11 = 3;
      pcVar15 = "HS: ws upgrade unauthorized";
    }
    else {
      _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n");
      iVar11 = 3;
      pcVar15 = "HS: ws upgrade response not 101";
    }
    goto LAB_00129f05;
  }
  plVar6 = (wsi->a).context;
  iVar11 = lws_hdr_total_length(wsi,WSI_TOKEN_ACCEPT);
  if (iVar11 == 0) {
    _lws_log(8,"no ACCEPT\n");
    iVar11 = 3;
    pcVar15 = "HS: ACCEPT missing";
    goto LAB_00129f05;
  }
  pcVar16 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_UPGRADE);
  pcVar15 = pcVar16;
  if (pcVar16 == (char *)0x0) {
    _lws_log(8,"no UPGRADE\n");
    iVar11 = 3;
    pcVar15 = "HS: UPGRADE missing";
    goto LAB_00129f05;
  }
  for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
    iVar11 = tolower((int)*pcVar15);
    *pcVar15 = (char)iVar11;
  }
  iVar11 = strcmp(pcVar16,"websocket");
  if (iVar11 != 0) {
    _lws_log(2,"lws_client_handshake: got bad Upgrade header \'%s\'\n",pcVar16);
    iVar11 = 3;
    pcVar15 = "HS: Upgrade to something other than websocket";
    goto LAB_00129f05;
  }
  lws_tokenize_init(&ts,buf,5);
  uVar12 = lws_hdr_copy(wsi,buf,0x3f,WSI_TOKEN_CONNECTION);
  if ((int)uVar12 < 1) {
LAB_00129ede:
    _lws_log(8,"%s: malfored connection \'%s\'\n","lws_client_ws_upgrade",buf);
    iVar11 = 3;
    pcVar15 = "HS: UPGRADE malformed";
    goto LAB_00129f05;
  }
  ts.len = (size_t)uVar12;
  do {
    do {
      lVar13 = lws_tokenize(&ts);
    } while (lVar13 == LWS_TOKZE_DELIMITER);
    if (lVar13 != LWS_TOKZE_TOKEN) goto LAB_00129ede;
    iVar11 = strncasecmp(ts.token,"upgrade",ts.token_len);
  } while (iVar11 != 0);
  pcVar15 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
  if (pcVar15 == (char *)0x0) {
    _lws_log(0x20,"lws_client_int_s_hs: no protocol list\n");
  }
  else {
    _lws_log(0x20,"lws_client_int_s_hs: protocol list \'%s\'\n",pcVar15);
  }
  iVar11 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
  if (iVar11 == 0) {
    uVar12 = 0;
    _lws_log(8,"%s: WSI_TOKEN_PROTOCOL is null\n","lws_client_ws_upgrade");
    plVar22 = (wsi->a).protocol;
    if (plVar22 != (lws_protocols *)0x0) {
      local_c0 = plVar22->name;
      goto LAB_0012a033;
    }
    (wsi->a).protocol = ((wsi->a).vhost)->protocols;
  }
  else {
    local_c0 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
    sVar17 = strlen(local_c0);
    cVar10 = '\x01';
    while ((pcVar15 != (char *)0x0 && (*pcVar15 != '\0' && cVar10 == -1))) {
      iVar11 = strncmp(pcVar15,local_c0,sVar17 & 0xffffffff);
      if ((iVar11 == 0) && ((pcVar15[(int)sVar17] == '\0' || (pcVar15[(int)sVar17] == ',')))) {
        cVar10 = '\0';
      }
      else {
        do {
          cVar2 = *pcVar15;
          if (cVar2 == '\0') break;
          pcVar15 = pcVar15 + 1;
        } while (cVar2 != ',');
        pcVar16 = pcVar15 + -1;
        do {
          pcVar15 = pcVar16 + 1;
          pcVar1 = pcVar16 + 1;
          pcVar16 = pcVar15;
        } while (*pcVar1 == ' ');
      }
    }
    if (cVar10 != '\0') {
      _lws_log(8,"%s: got bad protocol %s\n","lws_client_ws_upgrade",local_c0);
      iVar11 = 2;
      pcVar15 = "HS: PROTOCOL malformed";
      goto LAB_00129f05;
    }
LAB_0012a033:
    uVar4 = wsi->wsistate;
    if ((uVar4 >> 0x1c & 1) == 0) {
      (wsi->a).protocol = (lws_protocols *)0x0;
    }
    plVar7 = (wsi->a).vhost;
    uVar5 = plVar7->count_protocols;
    lVar19 = 0;
    uVar21 = 0;
    if (0 < (int)uVar5) {
      uVar21 = (ulong)uVar5;
    }
    for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
      if ((wsi->a).protocol == (lws_protocols *)0x0) {
        plVar22 = plVar7->protocols;
        iVar11 = strcmp(local_c0,*(char **)((long)&plVar22->name + lVar19));
        if (iVar11 == 0) {
          (wsi->a).protocol = (lws_protocols *)((long)&plVar22->name + lVar19);
          uVar21 = uVar20 & 0xffffffff;
          break;
        }
      }
      lVar19 = lVar19 + 0x38;
    }
    uVar12 = (uint)uVar21;
    if (uVar12 == uVar5) {
      if ((uVar4 >> 0x1c & 1) == 0) {
        _lws_log(8,"%s: fail protocol %s\n","lws_client_ws_upgrade",local_c0);
        iVar11 = 2;
        pcVar15 = "HS: Cannot match protocol";
      }
      else {
        plVar8 = (wsi->a).protocol;
        uVar12 = 0;
        for (plVar22 = plVar7->protocols; plVar22->callback != (lws_callback_function *)0x0;
            plVar22 = plVar22 + 1) {
          if ((plVar8 != (lws_protocols *)0x0) &&
             (iVar11 = strcmp(plVar8->name,plVar22->name), iVar11 == 0)) {
            (wsi->a).protocol = plVar22;
            goto LAB_0012a0ed;
          }
          uVar12 = uVar12 + 1;
        }
        if (plVar8 == (lws_protocols *)0x0) {
          _lws_log(1,"No protocol on client\n");
        }
        else {
          _lws_log(1,"Failed to match protocol %s\n",plVar8->name);
        }
        iVar11 = 2;
        pcVar15 = "ws protocol no match";
      }
      goto LAB_00129f05;
    }
    plVar22 = (wsi->a).protocol;
LAB_0012a0ed:
    _lws_log(0x10,"Selected protocol %s\n",plVar22->name);
  }
  lws_same_vh_protocol_insert(wsi,uVar12);
  pcVar15 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_ACCEPT);
  pcVar16 = ((wsi->http).ah)->initial_handshake_hash_base64;
  iVar11 = strcmp(pcVar15,pcVar16);
  if (iVar11 != 0) {
    iVar11 = 2;
    _lws_log(2,"lws_client_int_s_hs: accept \'%s\' wrong vs \'%s\'\n",pcVar15,pcVar16);
    pcVar15 = "HS: Accept hash wrong";
    goto LAB_00129f05;
  }
  iVar11 = lws_ensure_user_space(wsi);
  if (iVar11 == 0) {
    iVar11 = 2;
    iVar14 = (*((wsi->a).protocol)->callback)
                       (wsi,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,wsi->user_space,(void *)0x0,0);
    if (iVar14 != 0) {
      pcVar15 = "HS: Rejected by filter cb";
      goto LAB_00129f05;
    }
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
    lws_header_table_detach(wsi,0);
    lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,&role_ops_ws);
    lws_validity_confirmed(wsi);
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffffffffff9fff | 0x2000;
    uVar12 = (uint)((wsi->a).protocol)->rx_buffer_size;
    if (uVar12 == 0) {
      uVar12 = plVar6->pt_serv_buf_size;
    }
    puVar18 = (uchar *)lws_realloc((void *)0x0,(ulong)(uVar12 + 0x14),"client frame buffer");
    p_Var9 = wsi->ws;
    p_Var9->rx_ubuf = puVar18;
    if (puVar18 != (uchar *)0x0) {
      p_Var9->rx_ubuf_alloc = uVar12 + 0x10;
      _lws_log(0x10,"handshake OK for protocol %s\n",((wsi->a).protocol)->name);
      iVar11 = 3;
      iVar14 = (*((wsi->a).protocol)->callback)
                         (wsi,LWS_CALLBACK_CLIENT_ESTABLISHED,wsi->user_space,(void *)0x0,0);
      if (iVar14 == 0) {
        return 0;
      }
      pcVar15 = "HS: Rejected at CLIENT_ESTABLISHED";
      goto LAB_00129f05;
    }
    _lws_log(1,"Out of Mem allocating rx buffer %d\n",(ulong)(uVar12 + 0x10));
  }
  else {
    _lws_log(1,"Problem allocating wsi user mem\n");
  }
  iVar11 = 2;
  pcVar15 = "HS: OOM";
LAB_00129f05:
  *cce = pcVar15;
  return iVar11;
}

Assistant:

int
lws_client_ws_upgrade(struct lws *wsi, const char **cce)
{
	struct lws_context *context = wsi->a.context;
	struct lws_tokenize ts;
	int n, len, okay = 0;
	lws_tokenize_elem e;
	char *p, buf[64];
	const char *pc;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	char *sb = (char *)&pt->serv_buf[0];
	const struct lws_ext_options *opts;
	const struct lws_extension *ext;
	char ext_name[128];
	const char *c, *a;
	int more = 1;
	char ignore;
#endif

	if (wsi->client_mux_substream) {/* !!! client ws-over-h2 not there yet */
		lwsl_warn("%s: client ws-over-h2 upgrade not supported yet\n",
			  __func__);
		*cce = "HS: h2 / ws upgrade unsupported";
		goto bail3;
	}

	if (wsi->http.ah->http_response == 401) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade unauthorized";
		goto bail3;
	}

	if (wsi->http.ah->http_response != 101) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade response not 101";
		goto bail3;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_ACCEPT) == 0) {
		lwsl_info("no ACCEPT\n");
		*cce = "HS: ACCEPT missing";
		goto bail3;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_UPGRADE);
	if (!p) {
		lwsl_info("no UPGRADE\n");
		*cce = "HS: UPGRADE missing";
		goto bail3;
	}
	strtolower(p);
	if (strcmp(p, "websocket")) {
		lwsl_warn(
		      "lws_client_handshake: got bad Upgrade header '%s'\n", p);
		*cce = "HS: Upgrade to something other than websocket";
		goto bail3;
	}

	/* connection: must have "upgrade" */

	lws_tokenize_init(&ts, buf, LWS_TOKENIZE_F_COMMA_SEP_LIST |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	n = lws_hdr_copy(wsi, buf, sizeof(buf) - 1, WSI_TOKEN_CONNECTION);
	if (n <= 0) /* won't fit, or absent */
		goto bad_conn_format;
	ts.len = (unsigned int)n;

	do {
		e = lws_tokenize(&ts);
		switch (e) {
		case LWS_TOKZE_TOKEN:
			if (!strncasecmp(ts.token, "upgrade", ts.token_len))
				e = LWS_TOKZE_ENDED;
			break;

		case LWS_TOKZE_DELIMITER:
			break;

		default: /* includes ENDED found by the tokenizer itself */
bad_conn_format:
			lwsl_info("%s: malfored connection '%s'\n",
				  __func__, buf);
			*cce = "HS: UPGRADE malformed";
			goto bail3;
		}
	} while (e > 0);

	pc = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
#if defined(_DEBUG)
	if (!pc) {
		lwsl_parser("lws_client_int_s_hs: no protocol list\n");
	} else
		lwsl_parser("lws_client_int_s_hs: protocol list '%s'\n", pc);
#endif

	/*
	 * confirm the protocol the server wants to talk was in the list
	 * of protocols we offered
	 */

	len = lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL);
	if (!len) {
		lwsl_info("%s: WSI_TOKEN_PROTOCOL is null\n", __func__);
		/*
		 * no protocol name to work from, if we don't already have one
		 * default to first protocol
		 */

		if (wsi->a.protocol) {
			p = (char *)wsi->a.protocol->name;
			goto identify_protocol;
		}

		/* no choice but to use the default protocol */

		n = 0;
		wsi->a.protocol = &wsi->a.vhost->protocols[0];
		goto check_extensions;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL);
	len = (int)strlen(p);

	while (pc && *pc && !okay) {
		if (!strncmp(pc, p, (unsigned int)len) &&
		    (pc[len] == ',' || pc[len] == '\0')) {
			okay = 1;
			continue;
		}
		while (*pc && *pc++ != ',')
			;
		while (*pc == ' ')
			pc++;
	}

	if (!okay) {
		lwsl_info("%s: got bad protocol %s\n", __func__, p);
		*cce = "HS: PROTOCOL malformed";
		goto bail2;
	}

identify_protocol:

#if defined(LWS_WITH_HTTP_PROXY)
	lws_strncpy(wsi->ws->actual_protocol, p,
		    sizeof(wsi->ws->actual_protocol));
#endif

	/*
	 * identify the selected protocol struct and set it
	 */
	n = 0;
	/* keep client connection pre-bound protocol */
	if (!lwsi_role_client(wsi))
		wsi->a.protocol = NULL;

	while (n < wsi->a.vhost->count_protocols) {
		if (!wsi->a.protocol &&
		    strcmp(p, wsi->a.vhost->protocols[n].name) == 0) {
			wsi->a.protocol = &wsi->a.vhost->protocols[n];
			break;
		}
		n++;
	}

	if (n == wsi->a.vhost->count_protocols) { /* no match */
		/* if server, that's already fatal */
		if (!lwsi_role_client(wsi)) {
			lwsl_info("%s: fail protocol %s\n", __func__, p);
			*cce = "HS: Cannot match protocol";
			goto bail2;
		}

		/* for client, find the index of our pre-bound protocol */

		n = 0;
		while (wsi->a.vhost->protocols[n].callback) {
			if (wsi->a.protocol && strcmp(wsi->a.protocol->name,
				   wsi->a.vhost->protocols[n].name) == 0) {
				wsi->a.protocol = &wsi->a.vhost->protocols[n];
				break;
			}
			n++;
		}

		if (!wsi->a.vhost->protocols[n].callback) {
			if (wsi->a.protocol)
				lwsl_err("Failed to match protocol %s\n",
						wsi->a.protocol->name);
			else
				lwsl_err("No protocol on client\n");
			*cce = "ws protocol no match";
			goto bail2;
		}
	}

	lwsl_debug("Selected protocol %s\n", wsi->a.protocol->name);

check_extensions:
	/*
	 * stitch protocol choice into the vh protocol linked list
	 * We always insert ourselves at the start of the list
	 *
	 * X <-> B
	 * X <-> pAn <-> pB
	 */

	lws_same_vh_protocol_insert(wsi, n);

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/* instantiate the accepted extensions */

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_EXTENSIONS)) {
		lwsl_ext("no client extensions allowed by server\n");
		goto check_accept;
	}

	/*
	 * break down the list of server accepted extensions
	 * and go through matching them or identifying bogons
	 */

	if (lws_hdr_copy(wsi, sb, (int)context->pt_serv_buf_size,
			 WSI_TOKEN_EXTENSIONS) < 0) {
		lwsl_warn("ext list from server failed to copy\n");
		*cce = "HS: EXT: list too big";
		goto bail2;
	}

	c = sb;
	n = 0;
	ignore = 0;
	a = NULL;
	while (more) {

		if (*c && (*c != ',' && *c != '\t')) {
			if (*c == ';') {
				ignore = 1;
				if (!a)
					a = c + 1;
			}
			if (ignore || *c == ' ') {
				c++;
				continue;
			}

			ext_name[n] = *c++;
			if (n < (int)sizeof(ext_name) - 1)
				n++;
			continue;
		}
		ext_name[n] = '\0';
		ignore = 0;
		if (!*c)
			more = 0;
		else {
			c++;
			if (!n)
				continue;
		}

		/* check we actually support it */

		lwsl_notice("checking client ext %s\n", ext_name);

		n = 0;
		ext = wsi->a.vhost->ws.extensions;
		while (ext && ext->callback) {
			if (strcmp(ext_name, ext->name)) {
				ext++;
				continue;
			}

			n = 1;
			lwsl_notice("instantiating client ext %s\n", ext_name);

			/* instantiate the extension on this conn */

			wsi->ws->active_extensions[wsi->ws->count_act_ext] = ext;

			/* allow him to construct his ext instance */

			if (ext->callback(lws_get_context(wsi), ext, wsi,
				   LWS_EXT_CB_CLIENT_CONSTRUCT,
				   (void *)&wsi->ws->act_ext_user[
				                        wsi->ws->count_act_ext],
				   (void *)&opts, 0)) {
				lwsl_info(" ext %s failed construction\n",
					  ext_name);
				ext++;
				continue;
			}

			/*
			 * allow the user code to override ext defaults if it
			 * wants to
			 */
			ext_name[0] = '\0';
			if (user_callback_handle_rxflow(wsi->a.protocol->callback,
					wsi, LWS_CALLBACK_WS_EXT_DEFAULTS,
					(char *)ext->name, ext_name,
					sizeof(ext_name))) {
				*cce = "HS: EXT: failed setting defaults";
				goto bail2;
			}

			if (ext_name[0] &&
			    lws_ext_parse_options(ext, wsi,
					          wsi->ws->act_ext_user[
						        wsi->ws->count_act_ext],
					          opts, ext_name,
						  (int)strlen(ext_name))) {
				lwsl_err("%s: unable to parse user defaults '%s'",
					 __func__, ext_name);
				*cce = "HS: EXT: failed parsing defaults";
				goto bail2;
			}

			/*
			 * give the extension the server options
			 */
			if (a && lws_ext_parse_options(ext, wsi,
					wsi->ws->act_ext_user[
					                wsi->ws->count_act_ext],
					opts, a, lws_ptr_diff(c, a))) {
				lwsl_err("%s: unable to parse remote def '%s'",
					 __func__, a);
				*cce = "HS: EXT: failed parsing options";
				goto bail2;
			}

			if (ext->callback(lws_get_context(wsi), ext, wsi,
					LWS_EXT_CB_OPTION_CONFIRM,
				      wsi->ws->act_ext_user[wsi->ws->count_act_ext],
				      NULL, 0)) {
				lwsl_err("%s: ext %s rejects server options %s",
					 __func__, ext->name, a);
				*cce = "HS: EXT: Rejects server options";
				goto bail2;
			}

			wsi->ws->count_act_ext++;

			ext++;
		}

		if (n == 0) {
			lwsl_warn("Unknown ext '%s'!\n", ext_name);
			*cce = "HS: EXT: unknown ext";
			goto bail2;
		}

		a = NULL;
		n = 0;
	}

check_accept:
#endif

	/*
	 * Confirm his accept token is the one we precomputed
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_ACCEPT);
	if (strcmp(p, wsi->http.ah->initial_handshake_hash_base64)) {
		lwsl_warn("lws_client_int_s_hs: accept '%s' wrong vs '%s'\n", p,
				  wsi->http.ah->initial_handshake_hash_base64);
		*cce = "HS: Accept hash wrong";
		goto bail2;
	}

	/* allocate the per-connection user memory (if any) */
	if (lws_ensure_user_space(wsi)) {
		lwsl_err("Problem allocating wsi user mem\n");
		*cce = "HS: OOM";
		goto bail2;
	}

	/*
	 * we seem to be good to go, give client last chance to check
	 * headers and OK it
	 */
	if (wsi->a.protocol->callback(wsi,
				    LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected by filter cb";
		goto bail2;
	}

	/* clear his proxy connection timeout */
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	/* free up his parsing allocations */
	lws_header_table_detach(wsi, 0);

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED, &role_ops_ws);
	lws_validity_confirmed(wsi);

	wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

	/*
	 * create the frame buffer for this connection according to the
	 * size mentioned in the protocol definition.  If 0 there, then
	 * use a big default for compatibility
	 */
	n = (int)wsi->a.protocol->rx_buffer_size;
	if (!n)
		n = (int)context->pt_serv_buf_size;
	n += LWS_PRE;
	wsi->ws->rx_ubuf = lws_malloc((unsigned int)n + 4 /* 0x0000ffff zlib */,
				"client frame buffer");
	if (!wsi->ws->rx_ubuf) {
		lwsl_err("Out of Mem allocating rx buffer %d\n", n);
		*cce = "HS: OOM";
		goto bail2;
	}
	wsi->ws->rx_ubuf_alloc = (unsigned int)n;

	lwsl_debug("handshake OK for protocol %s\n", wsi->a.protocol->name);

	/* call him back to inform him he is up */

	if (wsi->a.protocol->callback(wsi, LWS_CALLBACK_CLIENT_ESTABLISHED,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected at CLIENT_ESTABLISHED";
		goto bail3;
	}

	return 0;

bail3:
	return 3;

bail2:
	return 2;
}